

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

uint64_t __thiscall obx::Transaction::getDataSizeCommitted(Transaction *this)

{
  int err;
  uint64_t size;
  uint64_t local_8;
  
  local_8 = 0;
  if (this->cTxn_ == (OBX_txn *)0x0) {
    internal::throwIllegalStateException("State condition failed: ","cTxn_");
  }
  err = obx_txn_data_size(this->cTxn_,&local_8,0);
  if (err == 0) {
    return local_8;
  }
  internal::throwLastError(err,(char *)0x0);
}

Assistant:

uint64_t Transaction::getDataSizeCommitted() const {
    uint64_t size = 0;
    internal::checkErrOrThrow(obx_txn_data_size(cPtr(), &size, nullptr));
    return size;
}